

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_same_stdout_stderr(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_buf_t local_2f0;
  uv_write_t write_req;
  uv_stdio_container_t stdio [3];
  uv_pipe_t out;
  uv_pipe_t in;
  
  init_process_options("spawn_helper3",exit_cb);
  local_2f0 = uv_buf_init("TEST",4);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&out,0);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&in,0);
  options.stdio = stdio;
  stdio[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  stdio[1].flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 2;
  stdio[0].data.stream = (uv_stream_t *)&in;
  stdio[1].data.stream = (uv_stream_t *)&out;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  write_req.data = (void *)(long)iVar1;
  if (write_req.data == (void *)0x0) {
    iVar1 = uv_process_kill(&process,0);
    write_req.data = (void *)(long)iVar1;
    if (write_req.data == (void *)0x0) {
      iVar1 = uv_write(&write_req,(uv_stream_t *)&in,&local_2f0,1,write_cb);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b == (void *)0x0) {
        iVar1 = uv_read_start((uv_stream_t *)&out,on_alloc,on_read);
        eval_b = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b == (void *)0x0) {
          eval_b = (int64_t)exit_cb_called;
          eval_b_2 = 0;
          if ((void *)eval_b == (void *)0x0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            eval_b = (int64_t)iVar1;
            eval_b_2 = 0;
            if ((void *)eval_b == (void *)0x0) {
              eval_b = 1;
              eval_b_2 = (int64_t)exit_cb_called;
              if (eval_b_2 == 1) {
                iVar1 = strcmp(output,"TEST");
                eval_b = (int64_t)iVar1;
                eval_b_2 = 0;
                if ((void *)eval_b == (void *)0x0) {
                  puVar2 = uv_default_loop();
                  close_loop(puVar2);
                  eval_b = 0;
                  puVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar2);
                  eval_b_2 = (int64_t)iVar1;
                  if (eval_b_2 == 0) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar5 = "uv_loop_close(uv_default_loop())";
                  pcVar4 = "0";
                  uVar3 = 999;
                }
                else {
                  pcVar5 = "0";
                  pcVar4 = "strcmp(output, \"TEST\")";
                  uVar3 = 0x3e5;
                }
              }
              else {
                pcVar5 = "exit_cb_called";
                pcVar4 = "1";
                uVar3 = 0x3e4;
              }
            }
            else {
              pcVar5 = "0";
              pcVar4 = "r";
              uVar3 = 0x3e2;
            }
          }
          else {
            pcVar5 = "0";
            pcVar4 = "exit_cb_called";
            uVar3 = 0x3df;
          }
        }
        else {
          pcVar5 = "0";
          pcVar4 = "r";
          uVar3 = 0x3dd;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "r";
        uVar3 = 0x3da;
      }
      goto LAB_00176a9a;
    }
    uVar3 = 0x3d7;
  }
  else {
    uVar3 = 0x3d1;
  }
  pcVar5 = "0";
  pcVar4 = "r";
  eval_b_2 = 0;
  eval_b = (int64_t)write_req.data;
LAB_00176a9a:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(spawn_same_stdout_stderr) {
  uv_write_t write_req;
  uv_pipe_t in, out;
  uv_buf_t buf;
  uv_stdio_container_t stdio[3];
  int r;

  init_process_options("spawn_helper3", exit_cb);
  buf = uv_buf_init("TEST", 4);

  uv_pipe_init(uv_default_loop(), &out, 0);
  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_process_kill(&process, 0);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  ASSERT_OK(exit_cb_called);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_OK(strcmp(output, "TEST"));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}